

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void mips_tr_tb_stop(DisasContextBase *dcbase,CPUState *cs)

{
  DisasJumpType DVar1;
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  DVar1 = dcbase->is_jmp;
  if (dcbase->singlestep_enabled != true) {
    switch(DVar1) {
    case DISAS_NEXT:
    case DISAS_TOO_MANY:
      save_cpu_state((DisasContext_conflict6 *)dcbase,0);
      gen_goto_tb((DisasContext_conflict6 *)dcbase,0,dcbase->pc_next);
      return;
    case DISAS_NORETURN:
      goto switchD_0086af4f_caseD_2;
    case DISAS_TARGET_0:
      gen_save_pc(tcg_ctx,dcbase->pc_next);
      tcg_gen_lookup_and_goto_ptr_mips64el(tcg_ctx);
      return;
    case DISAS_TARGET_1:
      tcg_gen_exit_tb_mips64el(tcg_ctx,(TranslationBlock *)0x0,0);
      return;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
                 ,0x7955,(char *)0x0);
    }
  }
  if (DVar1 == DISAS_NORETURN) {
switchD_0086af4f_caseD_2:
    return;
  }
  save_cpu_state((DisasContext_conflict6 *)dcbase,(uint)(DVar1 != DISAS_TARGET_1));
  gen_helper_raise_exception_debug(tcg_ctx,tcg_ctx->cpu_env);
  return;
}

Assistant:

static void mips_tr_tb_stop(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (ctx->base.singlestep_enabled && ctx->base.is_jmp != DISAS_NORETURN) {
        save_cpu_state(ctx, ctx->base.is_jmp != DISAS_EXIT);
        gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    } else {
        switch (ctx->base.is_jmp) {
        case DISAS_STOP:
            gen_save_pc(tcg_ctx, ctx->base.pc_next);
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            break;
        case DISAS_NEXT:
        case DISAS_TOO_MANY:
            save_cpu_state(ctx, 0);
            gen_goto_tb(ctx, 0, ctx->base.pc_next);
            break;
        case DISAS_EXIT:
            tcg_gen_exit_tb(tcg_ctx, NULL, 0);
            break;
        case DISAS_NORETURN:
            break;
        default:
            g_assert_not_reached();
        }
    }
}